

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::aboutToRemoveCell(QTextDocumentPrivate *this,int from,int to)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (piter)QHash<QTextCursorPrivate_*,_QHashDummyValue>::begin(&(this->cursors).q_hash);
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar1 = (local_30.d)->spans;
    uVar2 = local_30.bucket >> 7;
    QTextCursorPrivate::aboutToRemoveCell
              (*(QTextCursorPrivate **)
                pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)local_30.bucket & 0x7f]].storage.
                data,from,to);
    QHashPrivate::iterator<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_>::operator++
              (&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::aboutToRemoveCell(int from, int to)
{
    Q_ASSERT(from <= to);
    for (QTextCursorPrivate *curs : std::as_const(cursors))
        curs->aboutToRemoveCell(from, to);
}